

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaBackend.cpp
# Opt level: O0

void __thiscall xmrig::CudaBackend::CudaBackend(CudaBackend *this,Controller *controller)

{
  _func_int **pp_Var1;
  IBackend *in_RDI;
  Controller *in_stack_00000008;
  CudaBackendPrivate *in_stack_00000010;
  
  IBackend::IBackend(in_RDI);
  in_RDI->_vptr_IBackend = (_func_int **)&PTR__CudaBackend_002b83b8;
  pp_Var1 = (_func_int **)operator_new(0x80);
  CudaBackendPrivate::CudaBackendPrivate(in_stack_00000010,in_stack_00000008);
  in_RDI[1]._vptr_IBackend = pp_Var1;
  Workers<xmrig::CudaLaunchData>::setBackend
            ((Workers<xmrig::CudaLaunchData> *)(in_RDI[1]._vptr_IBackend + 0xc),in_RDI);
  return;
}

Assistant:

xmrig::CudaBackend::CudaBackend(Controller *controller) :
    d_ptr(new CudaBackendPrivate(controller))
{
    d_ptr->workers.setBackend(this);
}